

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

bool __thiscall jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,Array *array)

{
  pointer pEVar1;
  int iVar2;
  AST *pAVar3;
  pointer pEVar4;
  
  pEVar4 = (array->elements).
           super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (array->elements).
           super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar4 == pEVar1) {
      iVar2 = countNewlines(&array->closeFodder);
      return 0 < iVar2;
    }
    pAVar3 = left_recursive_deep(pEVar4->expr);
    iVar2 = countNewlines(&pAVar3->openFodder);
    pEVar4 = pEVar4 + 1;
  } while (iVar2 < 1);
  return true;
}

Assistant:

bool shouldExpand(const Array *array)
    {
        for (const auto &elem : array->elements) {
            if (countNewlines(open_fodder(elem.expr)) > 0) {
                return true;
            }
        }
        if (countNewlines(array->closeFodder) > 0) {
            return true;
        }
        return false;
    }